

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

void Js::JavascriptObject::ModifyGetterSetterFuncName
               (PropertyRecord *propertyRecord,PropertyDescriptor *descriptor,
               ScriptContext *scriptContext)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Var pvVar5;
  ScriptFunction *pSVar6;
  FunctionProxy *pFVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  undefined4 extraout_var_00;
  uint uVar9;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x844,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00cf328c;
    *puVar4 = 0;
  }
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x845,"(propertyRecord)","propertyRecord");
    if (!bVar2) {
LAB_00cf328c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((descriptor->getterSpecified != false) || (descriptor->setterSpecified == true)) {
    uVar9 = propertyRecord->byteCount >> 1;
    if (descriptor->getterSpecified != false) {
      pvVar5 = PropertyDescriptor::GetGetter(descriptor);
      bVar2 = VarIs<Js::ScriptFunction>(pvVar5);
      if (bVar2) {
        pvVar5 = PropertyDescriptor::GetGetter(descriptor);
        pSVar6 = VarTo<Js::ScriptFunction>(pvVar5);
        pFVar7 = ScriptFunction::GetFunctionProxy(pSVar6);
        iVar3 = (*(pFVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[7])(pFVar7);
        iVar3 = _wcsicmp((char16_t *)CONCAT44(extraout_var,iVar3),L"get");
        if (iVar3 == 0) {
          pcVar8 = ConstructName(propertyRecord,L".get",scriptContext);
          if (pcVar8 != (char16 *)0x0) {
            pvVar5 = PropertyDescriptor::GetGetter(descriptor);
            pSVar6 = VarTo<Js::ScriptFunction>(pvVar5);
            pFVar7 = ScriptFunction::GetFunctionProxy(pSVar6);
            (*(pFVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])
                      (pFVar7,pcVar8,(ulong)(uVar9 + 4),(ulong)(uVar9 + 1),3);
          }
        }
      }
    }
    if (descriptor->setterSpecified == true) {
      pvVar5 = PropertyDescriptor::GetSetter(descriptor);
      bVar2 = VarIs<Js::ScriptFunction>(pvVar5);
      if (bVar2) {
        pvVar5 = PropertyDescriptor::GetSetter(descriptor);
        pSVar6 = VarTo<Js::ScriptFunction>(pvVar5);
        pFVar7 = ScriptFunction::GetFunctionProxy(pSVar6);
        iVar3 = (*(pFVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[7])(pFVar7);
        iVar3 = _wcsicmp((char16_t *)CONCAT44(extraout_var_00,iVar3),L"set");
        if (iVar3 == 0) {
          pcVar8 = ConstructName(propertyRecord,L".set",scriptContext);
          if (pcVar8 != (char16 *)0x0) {
            pvVar5 = PropertyDescriptor::GetSetter(descriptor);
            pSVar6 = VarTo<Js::ScriptFunction>(pvVar5);
            pFVar7 = ScriptFunction::GetFunctionProxy(pSVar6);
            UNRECOVERED_JUMPTABLE =
                 (pFVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[6];
            (*UNRECOVERED_JUMPTABLE)
                      (pFVar7,pcVar8,(ulong)(uVar9 + 4),(ulong)(uVar9 + 1),3,UNRECOVERED_JUMPTABLE);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void JavascriptObject::ModifyGetterSetterFuncName(const PropertyRecord * propertyRecord, const PropertyDescriptor& descriptor, ScriptContext* scriptContext)
{
    Assert(scriptContext);
    Assert(propertyRecord);
    if (descriptor.GetterSpecified() || descriptor.SetterSpecified())
    {
        charcount_t propertyLength = propertyRecord->GetLength();

        if (descriptor.GetterSpecified()
            && Js::VarIs<Js::ScriptFunction>(descriptor.GetGetter())
            && _wcsicmp(Js::VarTo<Js::ScriptFunction>(descriptor.GetGetter())->GetFunctionProxy()->GetDisplayName(), _u("get")) == 0)
        {
            // modify to name.get
            const char16* finalName = ConstructName(propertyRecord, _u(".get"), scriptContext);
            if (finalName != nullptr)
            {
                FunctionProxy::SetDisplayNameFlags flags = (FunctionProxy::SetDisplayNameFlags) (FunctionProxy::SetDisplayNameFlagsDontCopy | FunctionProxy::SetDisplayNameFlagsRecyclerAllocated);

                Js::VarTo<Js::ScriptFunction>(descriptor.GetGetter())->GetFunctionProxy()->SetDisplayName(finalName,
                    propertyLength + 4 /*".get"*/, propertyLength + 1, flags);
            }
        }

        if (descriptor.SetterSpecified()
            && Js::VarIs<Js::ScriptFunction>(descriptor.GetSetter())
            && _wcsicmp(Js::VarTo<Js::ScriptFunction>(descriptor.GetSetter())->GetFunctionProxy()->GetDisplayName(), _u("set")) == 0)
        {
            // modify to name.set
            const char16* finalName = ConstructName(propertyRecord, _u(".set"), scriptContext);
            if (finalName != nullptr)
            {
                FunctionProxy::SetDisplayNameFlags flags = (FunctionProxy::SetDisplayNameFlags) (FunctionProxy::SetDisplayNameFlagsDontCopy | FunctionProxy::SetDisplayNameFlagsRecyclerAllocated);

                Js::VarTo<Js::ScriptFunction>(descriptor.GetSetter())->GetFunctionProxy()->SetDisplayName(finalName,
                    propertyLength + 4 /*".set"*/, propertyLength + 1, flags);
            }
        }
    }
}